

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
AddCleared(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  Type *in_stack_000000a8;
  RepeatedPtrFieldBase *in_stack_000000b0;
  
  internal::RepeatedPtrFieldBase::
  AddCleared<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (in_stack_000000b0,in_stack_000000a8);
  return;
}

Assistant:

inline void RepeatedPtrField<Element>::AddCleared(Element* value) {
  return RepeatedPtrFieldBase::AddCleared<TypeHandler>(value);
}